

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_traceexec(lua_State *L)

{
  uint uVar1;
  CallInfo *pCVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  int local_40;
  int local_38;
  bool local_31;
  int newline;
  int npc;
  Proto *p;
  int counthook;
  lu_byte mask;
  CallInfo *ci;
  lua_State *L_local;
  
  pCVar2 = L->ci;
  uVar1 = L->hookmask;
  iVar4 = L->hookcount + -1;
  L->hookcount = iVar4;
  bVar5 = (uVar1 & 8) != 0;
  local_31 = iVar4 == 0 && bVar5;
  if (iVar4 == 0 && bVar5) {
    L->hookcount = L->basehookcount;
  }
  else if ((uVar1 & 4) == 0) {
    return;
  }
  if ((pCVar2->callstatus & 0x40) != 0) {
    pCVar2->callstatus = pCVar2->callstatus & 0xffbf;
    return;
  }
  if (local_31) {
    luaD_hook(L,3,-1);
  }
  if ((uVar1 & 4) != 0) {
    lVar3 = *(long *)((pCVar2->func->value_).f + 0x18);
    iVar4 = (int)((long)(pCVar2->u).l.savedpc - *(long *)(lVar3 + 0x38) >> 2) + -1;
    if (*(long *)(lVar3 + 0x48) == 0) {
      local_38 = -1;
    }
    else {
      local_38 = *(int *)(*(long *)(lVar3 + 0x48) + (long)iVar4 * 4);
    }
    if ((iVar4 != 0) && (L->oldpc < (pCVar2->u).l.savedpc)) {
      if (*(long *)(lVar3 + 0x48) == 0) {
        local_40 = -1;
      }
      else {
        local_40 = *(int *)(*(long *)(lVar3 + 0x48) +
                           (long)((int)((long)L->oldpc - *(long *)(lVar3 + 0x38) >> 2) + -1) * 4);
      }
      if (local_38 == local_40) goto LAB_00114e34;
    }
    luaD_hook(L,2,local_38);
  }
LAB_00114e34:
  L->oldpc = (pCVar2->u).l.savedpc;
  if (L->status != '\x01') {
    return;
  }
  if (local_31) {
    L->hookcount = 1;
  }
  (pCVar2->u).l.savedpc = (Instruction *)((pCVar2->u).c.old_errfunc + -4);
  pCVar2->callstatus = pCVar2->callstatus | 0x40;
  pCVar2->func = L->top + -1;
  luaD_throw(L,1);
}

Assistant:

void luaG_traceexec (lua_State *L) {
  CallInfo *ci = L->ci;
  lu_byte mask = L->hookmask;
  int counthook = (--L->hookcount == 0 && (mask & LUA_MASKCOUNT));
  if (counthook)
    resethookcount(L);  /* reset count */
  else if (!(mask & LUA_MASKLINE))
    return;  /* no line hook and count != 0; nothing to be done */
  if (ci->callstatus & CIST_HOOKYIELD) {  /* called hook last time? */
    ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
    return;  /* do not call hook again (VM yielded, so it did not move) */
  }
  if (counthook)
    luaD_hook(L, LUA_HOOKCOUNT, -1);  /* call count hook */
  if (mask & LUA_MASKLINE) {
    Proto *p = ci_func(ci)->p;
    int npc = pcRel(ci->u.l.savedpc, p);
    int newline = getfuncline(p, npc);
    if (npc == 0 ||  /* call linehook when enter a new function, */
        ci->u.l.savedpc <= L->oldpc ||  /* when jump back (loop), or when */
        newline != getfuncline(p, pcRel(L->oldpc, p)))  /* enter a new line */
      luaD_hook(L, LUA_HOOKLINE, newline);  /* call line hook */
  }
  L->oldpc = ci->u.l.savedpc;
  if (L->status == LUA_YIELD) {  /* did hook yield? */
    if (counthook)
      L->hookcount = 1;  /* undo decrement to zero */
    ci->u.l.savedpc--;  /* undo increment (resume will increment it again) */
    ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
    ci->func = L->top - 1;  /* protect stack below results */
    luaD_throw(L, LUA_YIELD);
  }
}